

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O0

void __thiscall xLearn::Trainer::show_average_metric(Trainer *this)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  undefined8 uVar4;
  long in_RDI;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  size_t i;
  real_t metric;
  real_t loss;
  undefined8 in_stack_ffffffffffffff18;
  undefined1 uVar8;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  float fVar9;
  string local_a8 [32];
  string local_88 [48];
  string local_58 [32];
  string local_38 [32];
  ulong local_18;
  float local_10;
  float local_c;
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar5 [16];
  
  local_c = 0.0;
  local_10 = 0.0;
  local_18 = 0;
  while( true ) {
    uVar1 = local_18;
    sVar2 = std::vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::size
                      ((vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_> *)
                       (in_RDI + 0x40));
    uVar8 = (undefined1)((ulong)in_stack_ffffffffffffff18 >> 0x38);
    if (sVar2 <= uVar1) break;
    pvVar3 = std::vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::operator[]
                       ((vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_> *)
                        (in_RDI + 0x40),local_18);
    local_c = pvVar3->loss_val + local_c;
    if (*(long *)(in_RDI + 0x38) != 0) {
      pvVar3 = std::vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::operator[]
                         ((vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_> *)
                          (in_RDI + 0x40),local_18);
      local_10 = pvVar3->metric_val + local_10;
    }
    local_18 = local_18 + 1;
  }
  (**(code **)(**(long **)(in_RDI + 0x30) + 0x40))();
  uVar4 = std::__cxx11::string::c_str();
  fVar9 = local_c;
  auVar6._8_56_ = extraout_var;
  auVar6._0_8_ = extraout_XMM1_Qa;
  auVar5 = auVar6._0_16_;
  sVar2 = std::vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::size
                    ((vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_> *)
                     (in_RDI + 0x40));
  auVar5 = vcvtusi2ss_avx512f(auVar5,sVar2);
  StringPrintf_abi_cxx11_((char *)(double)(fVar9 / auVar5._0_4_),local_38,"Average %s: %.6f",uVar4);
  Color::print_info((string *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                    (bool)uVar8);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  if (*(long *)(in_RDI + 0x38) != 0) {
    uVar8 = (undefined1)((ulong)local_a8 >> 0x38);
    (**(code **)(**(long **)(in_RDI + 0x38) + 0x28))();
    uVar4 = std::__cxx11::string::c_str();
    auVar7._8_56_ = extraout_var_00;
    auVar7._0_8_ = extraout_XMM1_Qa_00;
    auVar5 = auVar7._0_16_;
    fVar9 = local_10;
    sVar2 = std::vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_>::size
                      ((vector<xLearn::MetricInfo,_std::allocator<xLearn::MetricInfo>_> *)
                       (in_RDI + 0x40));
    auVar5 = vcvtusi2ss_avx512f(auVar5,sVar2);
    StringPrintf_abi_cxx11_
              ((char *)(double)(fVar9 / auVar5._0_4_),local_88,"Average %s: %.6f",uVar4);
    Color::print_info((string *)CONCAT44(fVar9,in_stack_ffffffffffffff20),(bool)uVar8);
    std::__cxx11::string::~string(local_88);
    std::__cxx11::string::~string(local_a8);
  }
  return;
}

Assistant:

void Trainer::show_average_metric() {
  real_t loss = 0;
  real_t metric = 0;
  for (size_t i = 0; i < metric_info_.size(); ++i) {
    loss += metric_info_[i].loss_val;
    if (metric_ != nullptr) {
      metric += metric_info_[i].metric_val;
    }
  }
  Color::print_info(
    StringPrintf("Average %s: %.6f", 
    loss_->loss_type().c_str(), 
    loss / metric_info_.size())
  );
  if (metric_ != nullptr) {
    Color::print_info(
      StringPrintf("Average %s: %.6f", 
      metric_->metric_type().c_str(),
       metric / metric_info_.size())
    );
  }
}